

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDrawRectangleLines(Image *dst,Rectangle rec,int thick,Color color)

{
  int thick_local;
  Image *dst_local;
  undefined4 uStack_18;
  Color color_local;
  Rectangle rec_local;
  
  uStack_18 = rec.x;
  color_local = (Color)rec.y;
  rec_local.x = rec.width;
  ImageDrawRectangle(dst,(int)uStack_18,(int)(float)color_local,(int)rec_local.x,thick,color);
  rec_local.y = rec.height;
  ImageDrawRectangle(dst,(int)uStack_18,(int)((float)color_local + (float)thick),thick,
                     (int)(rec_local.y - (float)(thick << 1)),color);
  ImageDrawRectangle(dst,(int)((uStack_18 + rec_local.x) - (float)thick),
                     (int)((float)color_local + (float)thick),thick,
                     (int)(rec_local.y - (float)(thick << 1)),color);
  ImageDrawRectangle(dst,(int)uStack_18,(int)(((float)color_local + rec_local.y) - (float)thick),
                     (int)rec_local.x,thick,color);
  return;
}

Assistant:

void ImageDrawRectangleLines(Image *dst, Rectangle rec, int thick, Color color)
{
    ImageDrawRectangle(dst, (int)rec.x, (int)rec.y, (int)rec.width, thick, color);
    ImageDrawRectangle(dst, (int)rec.x, (int)(rec.y + thick), thick, (int)(rec.height - thick*2), color);
    ImageDrawRectangle(dst, (int)(rec.x + rec.width - thick), (int)(rec.y + thick), thick, (int)(rec.height - thick*2), color);
    ImageDrawRectangle(dst, (int)rec.x, (int)(rec.y + rec.height - thick), (int)rec.width, thick, color);
}